

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O3

int ARKodeSetRelaxFn(void *arkode_mem,ARKRelaxFn rfn,ARKRelaxJacFn rjac)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x1a7;
  }
  else {
    if (*(code **)((long)arkode_mem + 0x108) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0x108))();
      return iVar1;
    }
    msgfmt = "time-stepping module does not support relaxation";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x1b4;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetRelaxFn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_relaxation.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeSetRelaxFn(void* arkode_mem, ARKRelaxFn rfn, ARKRelaxJacFn rjac)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Call stepper-specific routine (if it exists) */
  if (ark_mem->step_setrelaxfn)
  {
    return ark_mem->step_setrelaxfn(arkode_mem, rfn, rjac);
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}